

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void f_xtra_act(keypress ch,wchar_t oid)

{
  undefined *puVar1;
  
  if (ch._0_8_ >> 0x20 == 0x54) {
    if (LIGHTING_DARK < f_uik_lighting) {
      f_uik_lighting = LIGHTING_LIT;
      return;
    }
    puVar1 = &DAT_002674f8;
  }
  else {
    if (ch.code != 0x74) {
      return;
    }
    if (LIGHTING_LIT < f_uik_lighting) {
      f_uik_lighting = LIGHTING_LIT;
      return;
    }
    puVar1 = &DAT_002664c8;
  }
  f_uik_lighting = *(grid_light_level *)(puVar1 + (ulong)f_uik_lighting * 4);
  return;
}

Assistant:

static void f_xtra_act(struct keypress ch, int oid)
{
	/* XXX must be a better way to cycle this */
	if (ch.code == 't') {
		switch (f_uik_lighting) {
				case LIGHTING_LIT:  f_uik_lighting = LIGHTING_TORCH; break;
                case LIGHTING_TORCH: f_uik_lighting = LIGHTING_LOS; break;
				case LIGHTING_LOS:  f_uik_lighting = LIGHTING_DARK; break;
				default:	f_uik_lighting = LIGHTING_LIT; break;
		}		
	} else if (ch.code == 'T') {
		switch (f_uik_lighting) {
				case LIGHTING_DARK:  f_uik_lighting = LIGHTING_LOS; break;
                case LIGHTING_LOS: f_uik_lighting = LIGHTING_TORCH; break;
				case LIGHTING_LIT:  f_uik_lighting = LIGHTING_DARK; break;
				default:	f_uik_lighting = LIGHTING_LIT; break;
		}
	}
	
}